

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O2

void __thiscall Random_keys::ordenaPopulacaoAtual(Random_keys *this,Graph *g)

{
  __normal_iterator<RK_Individual_**,_std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>_>
  __first;
  __normal_iterator<RK_Individual_**,_std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>_>
  __last;
  uint uVar1;
  reference ppRVar2;
  
  uVar1 = 0;
  while( true ) {
    __first._M_current =
         (this->popAtual).super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->popAtual).super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)__last._M_current - (long)__first._M_current >> 3) <= (ulong)uVar1) break;
    ppRVar2 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                        (&this->popAtual,(ulong)uVar1);
    RK_Individual::calculaFuncaoObjetivoOtimizado(*ppRVar2,g);
    uVar1 = uVar1 + 1;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<RK_Individual**,std::vector<RK_Individual*,std::allocator<RK_Individual*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(RK_Individual*,RK_Individual*)>>
            (__first,__last,(_Iter_comp_iter<bool_(*)(RK_Individual_*,_RK_Individual_*)>)0x105ef0);
  return;
}

Assistant:

void Random_keys::ordenaPopulacaoAtual(Graph *g){
    for(unsigned int i=0; i<popAtual.size(); i++)
        popAtual.at(i)->calculaFuncaoObjetivoOtimizado(g);
//        popAtual.at(i)->calculaFuncaoObjetivo(g);

    sort(popAtual.begin(), popAtual.end(), ordenacaoIndividuo);
}